

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_column_data.cpp
# Opt level: O1

void __thiscall
duckdb::ArrayColumnData::InitializePrefetch
          (ArrayColumnData *this,PrefetchState *prefetch_state,ColumnScanState *scan_state,
          idx_t rows)

{
  reference pvVar1;
  idx_t iVar2;
  pointer pCVar3;
  ColumnData *this_00;
  vector<duckdb::ColumnScanState,_true> *this_01;
  
  ColumnData::InitializePrefetch(&this->super_ColumnData,prefetch_state,scan_state,rows);
  this_01 = &scan_state->child_states;
  this_00 = (ColumnData *)this_01;
  pvVar1 = vector<duckdb::ColumnScanState,_true>::operator[](this_01,0);
  ColumnData::InitializePrefetch(this_00,prefetch_state,pvVar1,rows);
  iVar2 = ArrayType::GetSize(&(this->super_ColumnData).type);
  pCVar3 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                     (&this->child_column);
  pvVar1 = vector<duckdb::ColumnScanState,_true>::operator[](this_01,1);
  (*pCVar3->_vptr_ColumnData[6])
            (pCVar3,prefetch_state,pvVar1,iVar2 * rows,pCVar3->_vptr_ColumnData[6]);
  return;
}

Assistant:

void ArrayColumnData::InitializePrefetch(PrefetchState &prefetch_state, ColumnScanState &scan_state, idx_t rows) {
	ColumnData::InitializePrefetch(prefetch_state, scan_state, rows);
	validity.InitializePrefetch(prefetch_state, scan_state.child_states[0], rows);
	auto array_size = ArrayType::GetSize(type);
	child_column->InitializePrefetch(prefetch_state, scan_state.child_states[1], rows * array_size);
}